

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O0

void __thiscall nuraft::buffer_serializer::put_raw(buffer_serializer *this,void *raw_ptr,size_t len)

{
  bool bVar1;
  overflow_error *this_00;
  void *__dest;
  size_t in_RDX;
  buffer_serializer *in_RSI;
  buffer_serializer *in_RDI;
  buffer_serializer *in_stack_ffffffffffffffd8;
  buffer_serializer *in_stack_ffffffffffffffe0;
  
  bVar1 = is_valid(in_stack_ffffffffffffffd8,(size_t)in_RDI);
  if (!bVar1) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"not enough space");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  __dest = data(in_stack_ffffffffffffffe0);
  memcpy(__dest,in_RSI,in_RDX);
  pos(in_RDI);
  pos(in_RSI,in_RDX);
  return;
}

Assistant:

void buffer_serializer::put_raw(const void* raw_ptr, size_t len) {
    if ( !is_valid(len) ) throw std::overflow_error("not enough space");
    memcpy(data(), raw_ptr, len);
    pos( pos() + len );
}